

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O1

real_t __thiscall xLearn::AUCMetric::GetMetric(AUCMetric *this)

{
  real_t rVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_20,&this->all_positive_number_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,&this->all_negative_number_);
  rVar1 = CalcAUC(this,&local_20,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return rVar1;
}

Assistant:

real_t GetMetric() {
    return CalcAUC(all_positive_number_, 
                   all_negative_number_);
  }